

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

size_t ServerNetworkLayerTCP_stop(UA_ServerNetworkLayer *nl,UA_Job **jobs)

{
  void *pvVar1;
  UA_Job *pUVar2;
  ulong local_38;
  size_t i;
  UA_Job *items;
  ServerNetworkLayerTCP *layer;
  UA_Job **jobs_local;
  UA_ServerNetworkLayer *nl_local;
  
  pvVar1 = nl->handle;
  UA_LOG_INFO(*(UA_Logger *)((long)pvVar1 + 0x18),UA_LOGCATEGORY_NETWORK,
              "Shutting down the TCP network layer with %d open connection(s)",
              *(undefined8 *)((long)pvVar1 + 0x28));
  shutdown(*(int *)((long)pvVar1 + 0x20),2);
  close(*(int *)((long)pvVar1 + 0x20));
  pUVar2 = (UA_Job *)malloc(*(long *)((long)pvVar1 + 0x28) << 6);
  if (pUVar2 == (UA_Job *)0x0) {
    nl_local = (UA_ServerNetworkLayer *)0x0;
  }
  else {
    for (local_38 = 0; local_38 < *(ulong *)((long)pvVar1 + 0x28); local_38 = local_38 + 1) {
      socket_close(*(UA_Connection **)(*(long *)((long)pvVar1 + 0x30) + local_38 * 0x10));
      pUVar2[local_38 * 2].type = UA_JOBTYPE_DETACHCONNECTION;
      pUVar2[local_38 * 2].job.closeConnection =
           *(UA_Connection **)(*(long *)((long)pvVar1 + 0x30) + local_38 * 0x10);
      pUVar2[local_38 * 2 + 1].type = UA_JOBTYPE_METHODCALL_DELAYED;
      pUVar2[local_38 * 2 + 1].job.methodCall.method = FreeConnectionCallback;
      pUVar2[local_38 * 2 + 1].job.closeConnection =
           *(UA_Connection **)(*(long *)((long)pvVar1 + 0x30) + local_38 * 0x10);
    }
    *jobs = pUVar2;
    nl_local = (UA_ServerNetworkLayer *)(*(long *)((long)pvVar1 + 0x28) << 1);
  }
  return (size_t)nl_local;
}

Assistant:

static size_t
ServerNetworkLayerTCP_stop(UA_ServerNetworkLayer *nl, UA_Job **jobs) {
    ServerNetworkLayerTCP *layer = nl->handle;
    UA_LOG_INFO(layer->logger, UA_LOGCATEGORY_NETWORK,
                "Shutting down the TCP network layer with %d open connection(s)",
                layer->mappingsSize);
    shutdown((SOCKET)layer->serversockfd,2);
    CLOSESOCKET(layer->serversockfd);
    UA_Job *items = malloc(sizeof(UA_Job) * layer->mappingsSize * 2);
    if(!items)
        return 0;
    for(size_t i = 0; i < layer->mappingsSize; ++i) {
        socket_close(layer->mappings[i].connection);
        items[i*2].type = UA_JOBTYPE_DETACHCONNECTION;
        items[i*2].job.closeConnection = layer->mappings[i].connection;
        items[(i*2)+1].type = UA_JOBTYPE_METHODCALL_DELAYED;
        items[(i*2)+1].job.methodCall.method = FreeConnectionCallback;
        items[(i*2)+1].job.methodCall.data = layer->mappings[i].connection;
    }
#ifdef _WIN32
    WSACleanup();
#endif
    *jobs = items;
    return layer->mappingsSize*2;
}